

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

size_t psset_purge_list_ind(hpdata_t *ps)

{
  long lVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  if (ps->h_nactive == 0) {
    sVar2 = (ulong)ps->h_huge | 0x7e;
  }
  else {
    sVar2 = duckdb_je_sz_psz_quantize_floor((ps->h_ntouched - ps->h_nactive) * 0x1000);
    if (sVar2 < 0x7000000000000001) {
      uVar5 = sVar2 - 1;
      if (uVar5 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar4 = (uint)lVar1 ^ 0x3f;
      }
      iVar6 = 0x32 - uVar4;
      if (0x32 < uVar4) {
        iVar6 = 0;
      }
      bVar3 = 0xc;
      if (0x4000 < sVar2) {
        bVar3 = (char)iVar6 + 0xb;
      }
      uVar5 = (ulong)(iVar6 * 8 + ((uint)(uVar5 >> (bVar3 & 0x3f)) & 3) * 2);
    }
    else {
      uVar5 = 0x18e;
    }
    sVar2 = (ulong)ps->h_huge ^ 1 | uVar5;
  }
  return sVar2;
}

Assistant:

static size_t
psset_purge_list_ind(hpdata_t *ps) {
	size_t ndirty = hpdata_ndirty_get(ps);
	/* Shouldn't have something with no dirty pages purgeable. */
	assert(ndirty > 0);
	/*
	 * Higher indices correspond to lists we'd like to purge earlier; make
	 * the two highest indices correspond to empty lists, which we attempt
	 * to purge before purging any non-empty list.  This has two advantages:
	 * - Empty page slabs are the least likely to get reused (we'll only
	 *   pick them for an allocation if we have no other choice).
	 * - Empty page slabs can purge every dirty page they contain in a
	 *   single call, which is not usually the case.
	 *
	 * We purge hugeified empty slabs before nonhugeified ones, on the basis
	 * that they are fully dirty, while nonhugified slabs might not be, so
	 * we free up more pages more easily.
	 */
	if (hpdata_nactive_get(ps) == 0) {
		if (hpdata_huge_get(ps)) {
			return PSSET_NPURGE_LISTS - 1;
		} else {
			return PSSET_NPURGE_LISTS - 2;
		}
	}

	pszind_t pind = sz_psz2ind(sz_psz_quantize_floor(ndirty << LG_PAGE));
	/*
	 * For non-empty slabs, we may reuse them again.  Prefer purging
	 * non-hugeified slabs before hugeified ones then, among pages of
	 * similar dirtiness.  We still get some benefit from the hugification.
	 */
	return (size_t)pind * 2 + (hpdata_huge_get(ps) ? 0 : 1);
}